

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<float>_>::SolveSOR
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_6,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  float __f;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar1;
  double extraout_XMM0_Qa_00;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int64_t j;
  int64_t ic;
  complex<float> eqres;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  complex<float> res;
  complex<float> *in_stack_fffffffffffffeb8;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 uVar2;
  complex<float> *this_00;
  complex<float> *this_01;
  undefined4 in_stack_fffffffffffffee0;
  float __i;
  complex<float> local_f0 [4];
  undefined8 local_d0;
  long local_c0;
  long local_b0;
  double local_a8;
  complex<float> local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  int64_t local_70;
  long local_68;
  complex<float> local_60;
  complex<float> local_58;
  complex<float> local_50 [2];
  complex<float> local_40;
  double local_38;
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    this_00 = local_50;
    __i = 0.0;
    local_38 = in_XMM0_Qa;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::complex<float>::complex(this_00,2.0,0.0);
    this_01 = &local_58;
    std::complex<float>::complex(this_01,(float)*in_stack_00000008,__i);
    std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x12aa127);
    std::complex<float>::complex(&local_60,1.0,__i);
    std::operator+(in_stack_fffffffffffffeb8,(complex<float> *)0x12aa162);
    local_40._M_value = (_ComplexT)extraout_XMM0_Qa;
    if (local_28 != (TPZBaseMatrix *)0x0) {
      __f = ::Norm(in_stack_fffffffffffffec0);
      std::complex<float>::operator=(&local_40,__f);
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    local_68 = (**(code **)(*in_RDI + 0x60))();
    local_70 = TPZBaseMatrix::Cols(local_18);
    local_80 = 0;
    local_88 = local_68;
    local_90 = 1;
    if (in_stack_00000018 == -1) {
      local_80 = local_68 + -1;
      local_88 = -1;
      local_90 = -1;
    }
    std::complex<float>::complex(&local_a0,0.0,0.0);
    local_98 = 0;
    while( true ) {
      uVar2 = false;
      if (local_98 < *local_10) {
        local_a8 = (double)local_40._M_value;
        dVar1 = fabs((double)local_40._M_value);
        uVar2 = ABS(*in_stack_00000008) < (double)SUB84(dVar1,0);
      }
      if ((bool)uVar2 == false) break;
      std::complex<float>::operator=(&local_40,0.0);
      for (local_b0 = 0; local_b0 < local_70; local_b0 = local_b0 + 1) {
        for (local_78 = local_80; local_78 != local_88; local_78 = local_90 + local_78) {
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_78,local_b0);
          for (local_c0 = 0; local_c0 < local_68; local_c0 = local_c0 + 1) {
            local_d0 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_78,local_c0);
            TPZFMatrix<std::complex<float>_>::operator()
                      ((TPZFMatrix<std::complex<float>_> *)CONCAT44(__i,in_stack_fffffffffffffee0),
                       (int64_t)this_01,(int64_t)this_00);
            std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x12aa3c1);
            std::complex<float>::operator-=
                      (this_00,(complex<float> *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
          }
          std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x12aa40d);
          std::complex<float>::operator+=
                    (this_00,(complex<float> *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffeb8 = local_f0;
          std::complex<float>::complex(in_stack_fffffffffffffeb8,(float)local_38,0.0);
          std::operator*(in_stack_fffffffffffffeb8,(complex<float> *)0x12aa451);
          (**(code **)(*in_RDI + 0x120))(in_RDI,local_78);
          std::operator/(in_stack_fffffffffffffeb8,(complex<float> *)0x12aa488);
          TPZFMatrix<std::complex<float>_>::operator()
                    ((TPZFMatrix<std::complex<float>_> *)CONCAT44(__i,in_stack_fffffffffffffee0),
                     (int64_t)this_01,(int64_t)this_00);
          std::complex<float>::operator+=
                    (this_00,(complex<float> *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
        }
      }
      std::sqrt<float>(this_01);
      local_98 = local_98 + 1;
      local_40._M_value = (_ComplexT)extraout_XMM0_Qa_00;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_98;
    dVar1 = fabs((double)local_40._M_value);
    *in_stack_00000008 = (double)SUB84(dVar1,0);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}